

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

void __thiscall
wasm::DataFlow::Graph::merge
          (Graph *this,
          vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
          *states,Locals *out)

{
  pointer pFVar1;
  size_t sVar2;
  Type TVar3;
  pointer pFVar4;
  Node *pNVar5;
  Node *pNVar6;
  pointer pFVar7;
  FlowState *state_1;
  long lVar8;
  ulong uVar9;
  Index index;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  vector<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
  *__range3;
  bool bVar13;
  Node *local_38;
  
  pFVar1 = (states->
           super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pFVar4 = (states->
           super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (pFVar7 = pFVar4; pFVar7 != pFVar1; pFVar7 = pFVar7 + 1) {
    if ((pFVar7->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pFVar7->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("!isInUnreachable(state.locals)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                    ,0x296,"void wasm::DataFlow::Graph::merge(std::vector<FlowState> &, Locals &)");
    }
  }
  uVar11 = (ulong)((long)pFVar1 - (long)pFVar4) >> 5;
  iVar10 = (int)uVar11;
  if (iVar10 == 0) {
    if ((this->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("isInUnreachable()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                    ,0x29c,"void wasm::DataFlow::Graph::merge(std::vector<FlowState> &, Locals &)");
    }
  }
  else {
    sVar2 = Function::getNumLocals(this->func);
    std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::resize
              (&this->locals,sVar2);
    if (iVar10 == 1) {
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::operator=
                (out,&((states->
                       super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                       )._M_impl.super__Vector_impl_data._M_start)->locals);
      return;
    }
    sVar2 = Function::getNumLocals(this->func);
    if ((int)sVar2 != 0) {
      uVar9 = 0;
      local_38 = (Node *)0x0;
      do {
        TVar3 = Function::getLocalType(this->func,(Index)uVar9);
        if ((TVar3.id & 0xfffffffffffffffe) == 2) {
          pFVar4 = (states->
                   super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pFVar1 = (states->
                   super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pFVar7 = pFVar4;
          if (pFVar4 != pFVar1) {
            do {
              pNVar5 = (pFVar7->locals).
                       super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar9];
              if (pNVar5->type == Bad) goto LAB_00829478;
              pFVar7 = pFVar7 + 1;
            } while (pFVar7 != pFVar1);
            if (pFVar4 != pFVar1) {
              pNVar5 = (Node *)0x0;
              do {
                pNVar6 = (pFVar4->locals).
                         super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar9];
                if (pNVar5 != (Node *)0x0) {
                  bVar13 = pNVar6 == pNVar5;
                  pNVar6 = pNVar5;
                  if (bVar13) goto LAB_0082935c;
                  if (local_38 == (Node *)0x0) {
                    pNVar5 = (Node *)operator_new(0x30);
                    pNVar5->type = Block;
                    pNVar5->origin = (Expression *)0x0;
                    (pNVar5->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    (pNVar5->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    (pNVar5->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_38 = addNode(this,pNVar5);
                    lVar8 = 0x18;
                    uVar12 = 0;
                    do {
                      pNVar5 = *(Node **)((long)&(((states->
                                                  super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 locals).
                                                 super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                                 ._M_impl + lVar8);
                      if (pNVar5->type != Bad) {
                        pNVar5 = Node::makeCond(local_38,(Index)uVar12,pNVar5);
                        pNVar5 = addNode(this,pNVar5);
                      }
                      Node::addValue(local_38,pNVar5);
                      uVar12 = uVar12 + 1;
                      lVar8 = lVar8 + 0x20;
                    } while ((uVar11 & 0xffffffff) != uVar12);
                  }
                  pNVar5 = (Node *)operator_new(0x30);
                  pNVar5->type = Phi;
                  pNVar5->origin = (Expression *)0x0;
                  (pNVar5->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  (pNVar5->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  (pNVar5->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  Node::addValue(pNVar5,local_38);
                  (pNVar5->field_1).index = (Index)uVar9;
                  pNVar5 = addNode(this,pNVar5);
                  pFVar1 = (states->
                           super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                  for (pFVar4 = (states->
                                super__Vector_base<wasm::DataFlow::Graph::FlowState,_std::allocator<wasm::DataFlow::Graph::FlowState>_>
                                )._M_impl.super__Vector_impl_data._M_start; pFVar4 != pFVar1;
                      pFVar4 = pFVar4 + 1) {
                    pNVar6 = expandFromI1(this,(pFVar4->locals).
                                               super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar9],
                                          (Expression *)0x0);
                    Node::addValue(pNVar5,pNVar6);
                  }
LAB_00829478:
                  (out->
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar9] = pNVar5;
                  break;
                }
                (out->
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>)
                ._M_impl.super__Vector_impl_data._M_start[uVar9] = pNVar6;
LAB_0082935c:
                pFVar4 = pFVar4 + 1;
                pNVar5 = pNVar6;
              } while (pFVar4 != pFVar1);
            }
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != (sVar2 & 0xffffffff));
    }
  }
  return;
}

Assistant:

void merge(std::vector<FlowState>& states, Locals& out) {
    // We should only receive reachable states.
#ifndef NDEBUG
    for (auto& state : states) {
      assert(!isInUnreachable(state.locals));
    }
#endif
    Index numStates = states.size();
    if (numStates == 0) {
      // We were unreachable, and still are.
      assert(isInUnreachable());
      return;
    }
    // We may have just become reachable, if we were not before.
    setInReachable();
    // Just one thing to merge is trivial.
    if (numStates == 1) {
      out = states[0].locals;
      return;
    }
    // We create a block if we need one.
    Index numLocals = func->getNumLocals();
    Node* block = nullptr;
    for (Index i = 0; i < numLocals; i++) {
      if (!isRelevantType(func->getLocalType(i))) {
        continue;
      }
      // Process the inputs. If any is bad, the phi is bad.
      bool bad = false;
      for (auto& state : states) {
        auto* node = state.locals[i];
        if (node->isBad()) {
          bad = true;
          out[i] = node;
          break;
        }
      }
      if (bad) {
        continue;
      }
      // Nothing is bad, proceed.
      Node* first = nullptr;
      for (auto& state : states) {
        if (!first) {
          first = out[i] = state.locals[i];
        } else if (state.locals[i] != first) {
          // We need to actually merge some stuff.
          if (!block) {
            block = addNode(Node::makeBlock());
            for (Index index = 0; index < numStates; index++) {
              auto* condition = states[index].condition;
              if (!condition->isBad()) {
                condition = addNode(Node::makeCond(block, index, condition));
              }
              block->addValue(condition);
            }
          }
          auto* phi = addNode(Node::makePhi(block, i));
          for (auto& state : states) {
            auto* value = expandFromI1(state.locals[i], nullptr);
            phi->addValue(value);
          }
          out[i] = phi;
          break;
        }
      }
    }
  }